

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O1

QList<QSize> * __thiscall
QOpenGLFramebufferObject::sizes(QList<QSize> *__return_storage_ptr__,QOpenGLFramebufferObject *this)

{
  QOpenGLFramebufferObjectPrivate *pQVar1;
  ColorAttachment *color;
  QSize *args;
  long lVar2;
  
  pQVar1 = (this->d_ptr).d;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSize *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QSize>::reserve
            (__return_storage_ptr__,
             (pQVar1->colorAttachments).
             super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.super_QVLABaseBase.s);
  lVar2 = (pQVar1->colorAttachments).
          super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.super_QVLABaseBase.s;
  if (lVar2 != 0) {
    args = (QSize *)(pQVar1->colorAttachments).
                    super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.
                    super_QVLABaseBase.ptr;
    lVar2 = lVar2 * 0x18;
    do {
      QtPrivate::QMovableArrayOps<QSize>::emplace<QSize_const&>
                ((QMovableArrayOps<QSize> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 args);
      QList<QSize>::end(__return_storage_ptr__);
      args = args + 3;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QSize> QOpenGLFramebufferObject::sizes() const
{
    Q_D(const QOpenGLFramebufferObject);
    QList<QSize> sz;
    sz.reserve(d->colorAttachments.size());
    for (const auto &color : d->colorAttachments)
        sz.append(color.size);
    return sz;
}